

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

string * __thiscall
phosg::Image::save_abi_cxx11_(string *__return_storage_ptr__,Image *this,Format format)

{
  undefined1 *puVar1;
  uint8_t *__s;
  void *pvVar2;
  long lVar3;
  uint uVar4;
  ssize_t x;
  size_t __n;
  long lVar5;
  runtime_error *prVar6;
  char *__format;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  anon_class_8_1_6971b95b local_188;
  unique_ptr<void,_void_(*)(void_*)> row_data_unique;
  uint8_t row_padding_data [4];
  _Head_base<0UL,_void_*,_false> local_168;
  uLongf idat_size;
  be_uint32_t gAMA;
  uint8_t SIG [8];
  anon_struct_13_7_88857fac IHDR;
  char header [256];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_188.result = __return_storage_ptr__;
  switch(format) {
  case GRAYSCALE_PPM:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save grayscale ppm files");
    break;
  case COLOR_PPM:
    __format = "P6 %zu %zu %lu\n";
    if (this->has_alpha != false) {
      __format = "P7\nWIDTH %zu\nHEIGHT %zu\nDEPTH 4\nMAXVAL %lu\nTUPLTYPE RGB_ALPHA\nENDHDR\n";
    }
    snprintf(header,0x100,__format,this->width,this->height,this->max_value);
    __n = strlen(header);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,header,__n);
    __s = (this->data).as8;
    sVar10 = get_data_size(this);
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (__return_storage_ptr__,(char *)__s,sVar10);
    return __return_storage_ptr__;
  case WINDOWS_BITMAP:
    if (this->channel_width == '\b') {
      sVar10 = (ulong)this->has_alpha + 3;
      uVar8 = (ulong)(-((int)sVar10 * (int)this->width) & 3);
      row_padding_data[0] = '\0';
      row_padding_data[1] = '\0';
      row_padding_data[2] = '\0';
      row_padding_data[3] = '\0';
      sVar10 = init_bmp_header((WindowsBitmapHeader *)header,this->width,this->height,
                               this->has_alpha,sVar10,uVar8);
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,header,sVar10);
      if (this->has_alpha == true) {
        lVar7 = this->height * 4;
        lVar9 = this->height + 1;
        while( true ) {
          lVar7 = lVar7 + -4;
          lVar9 = lVar9 + -1;
          if (lVar9 < 1) break;
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,(char *)(lVar7 * this->width + (long)(this->data).raw),
                     this->width << 2);
        }
        return __return_storage_ptr__;
      }
      malloc_unique((phosg *)&row_data_unique,this->width * 3);
      lVar7 = this->height;
      lVar9 = lVar7 * 3;
      while (lVar9 = lVar9 + -3, 0 < lVar7) {
        lVar7 = lVar7 + -1;
        lVar5 = 0;
        while( true ) {
          lVar3 = this->width;
          if (SBORROW8(lVar5,lVar3 * 3) == lVar5 + lVar3 * -3 < 0) break;
          *(undefined1 *)
           ((long)row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_void_*,_false>._M_head_impl + lVar5) =
               *(undefined1 *)((long)(this->data).raw + lVar5 + 2 + lVar3 * lVar9);
          *(undefined1 *)
           ((long)row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_void_*,_false>._M_head_impl + lVar5 + 1) =
               *(undefined1 *)((long)(this->data).raw + lVar5 + 1 + this->width * lVar9);
          *(undefined1 *)
           ((long)row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                  super__Head_base<0UL,_void_*,_false>._M_head_impl + lVar5 + 2) =
               *(undefined1 *)((long)(this->data).raw + lVar5 + this->width * lVar9);
          lVar5 = lVar5 + 3;
        }
        ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (__return_storage_ptr__,
                   (char *)row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                           super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_void_*,_false>._M_head_impl,lVar3 * 3);
        if (uVar8 != 0) {
          ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (__return_storage_ptr__,(char *)row_padding_data,uVar8);
        }
      }
LAB_001087f9:
      ::std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr(&row_data_unique);
      return __return_storage_ptr__;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save bmp with more than 8-bit channels");
    break;
  case PNG:
    if (this->channel_width == '\b') {
      SIG[0] = 0x89;
      SIG[1] = 'P';
      SIG[2] = 'N';
      SIG[3] = 'G';
      SIG[4] = '\r';
      SIG[5] = '\n';
      SIG[6] = '\x1a';
      SIG[7] = '\n';
      ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (__return_storage_ptr__,(char *)SIG,8);
      uVar4 = (uint)this->width;
      IHDR.width.super_reverse_endian<unsigned_int,_unsigned_int>.
      super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
      .value = (reverse_endian<unsigned_int,_unsigned_int>)
               (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
      uVar4 = (uint)this->height;
      IHDR.height.super_reverse_endian<unsigned_int,_unsigned_int>.
      super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
      .value = (reverse_endian<unsigned_int,_unsigned_int>)
               (uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18);
      IHDR.bit_depth = '\b';
      IHDR.color_type = this->has_alpha << 2 | 2;
      IHDR.compression = '\0';
      IHDR.filter = '\0';
      IHDR.interlace = '\0';
      write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                ((char (*) [5])"IHDR",&IHDR,(be_uint32_t)0xd000000,&local_188);
      gAMA.super_reverse_endian<unsigned_int,_unsigned_int>.
      super_converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
      .value = (reverse_endian<unsigned_int,_unsigned_int>)
               (converted_endian<unsigned_int,_unsigned_int,_phosg::bswap_st<unsigned_int,_unsigned_int>,_phosg::bswap_st<unsigned_int,_unsigned_int>_>
                )0x8fb10000;
      write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                ((char (*) [5])"gAMA",&gAMA,(be_uint32_t)0x4000000,&local_188);
      lVar7 = (ulong)this->has_alpha + 3;
      sVar10 = (this->width * lVar7 + 1) * this->height;
      malloc_unique((phosg *)&row_data_unique,sVar10);
      for (uVar4 = 0; uVar8 = (ulong)uVar4, uVar8 < (ulong)this->height; uVar4 = uVar4 + 1) {
        lVar9 = this->width;
        pvVar2 = (this->data).raw;
        puVar1 = (undefined1 *)
                 ((long)row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_void_*,_false>._M_head_impl +
                 (lVar9 * lVar7 + 1) * uVar8);
        *puVar1 = 0;
        memcpy(puVar1 + 1,(void *)(uVar8 * lVar7 * lVar9 + (long)pvVar2),this->width * lVar7);
      }
      idat_size = compressBound(sVar10);
      malloc_unique((phosg *)row_padding_data,idat_size);
      uVar4 = compress2(local_168._M_head_impl,&idat_size,
                        row_data_unique._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                        super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                        super__Head_base<0UL,_void_*,_false>._M_head_impl,sVar10,9);
      if (uVar4 != 0) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        string_printf_abi_cxx11_
                  ((string *)header,"zlib error compressing png data: %d",(ulong)uVar4);
        ::std::runtime_error::runtime_error(prVar6,(string *)header);
        __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                ((char (*) [5])"IDAT",local_168._M_head_impl,
                 (be_uint32_t)
                 ((uint)idat_size >> 0x18 | ((uint)idat_size & 0xff0000) >> 8 |
                  ((uint)idat_size & 0xff00) << 8 | (uint)idat_size << 0x18),&local_188);
      write_png_chunk<phosg::Image::save[abi:cxx11](phosg::Image::Format)const::__0&>
                ((char (*) [5])"IEND",(void *)0x0,(be_uint32_t)0x0,&local_188);
      ::std::unique_ptr<void,_void_(*)(void_*)>::~unique_ptr
                ((unique_ptr<void,_void_(*)(void_*)> *)row_padding_data);
      goto LAB_001087f9;
    }
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"can\'t save png with more than 8-bit channels");
    break;
  default:
    prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar6,"unknown file format in Image::save()");
  }
  __cxa_throw(prVar6,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

string Image::save(Format format) const {
  string result;
  this->save_helper(format, [&result](const void* data, size_t size) {
    result.append(reinterpret_cast<const char*>(data), size);
  });
  return result;
}